

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.cpp
# Opt level: O3

void cancelRequest(Id *id)

{
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_78;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_38;
  
  local_78.os_ = &local_38;
  local_38.stack_.stack_ = (char *)0x0;
  local_38.stack_.stackTop_ = (char *)0x0;
  local_38.stack_.allocator_ = (CrtAllocator *)0x0;
  local_38.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_38.stack_.stackEnd_ = (char *)0x0;
  local_38.stack_.initialCapacity_ = 0x100;
  local_78.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_78.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_78.level_stack_.stack_ = (char *)0x0;
  local_78.level_stack_.stackTop_ = (char *)0x0;
  local_78.level_stack_.stackEnd_ = (char *)0x0;
  local_78.level_stack_.initialCapacity_ = 0x200;
  local_78.maxDecimalPlaces_ = 0x144;
  local_78.hasRoot_ = false;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_78);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_78,"jsonrpc",7,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_78,"2.0",3,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_78,"method",6,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_78,"$/cancelRequest",0xf,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_78,"params",6,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_78);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_78,"id",2,false);
  Id::writeId(id,&local_78);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_78,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_78,0);
  sendMessage(&local_38);
  free(local_78.level_stack_.stack_);
  operator_delete(local_78.level_stack_.ownAllocator_,1);
  free(local_38.stack_.stack_);
  operator_delete(local_38.stack_.ownAllocator_,1);
  return;
}

Assistant:

void cancelRequest (Id &id) {
    INIT_WRITER

    ADD_METHOD("$/cancelRequest");
    writer.Key("params"); writer.StartObject();
    ADD_ID(id);
    writer.EndObject();

    SEND_MESSAGE
}